

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  bool bVar1;
  int iVar2;
  CppType CVar3;
  uint32_t uVar4;
  int32_t value;
  undefined4 extraout_var;
  FieldDescriptor *this_00;
  undefined4 extraout_var_00;
  FieldDescriptor *this_01;
  RepeatedPtrField<google::protobuf::Message> *pRVar5;
  LogMessage *other;
  uint64_t value_00;
  int64_t value_01;
  value_type *pvVar6;
  Message *pMVar7;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  Rep *pRVar8;
  Reflection *this_03;
  void **ppvVar9;
  void **ppvVar10;
  InnerMap *m;
  float fVar11;
  pointer pcVar12;
  LogFinisher local_b9;
  InnerMap *local_b8;
  iterator iter;
  string local_78;
  MapKey map_key;
  
  m = &(this->map_).elements_;
  (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  this_00 = Descriptor::map_key((Descriptor *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  this_01 = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var_00,iVar2));
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.arena_ == (Arena *)0x0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
    ::iterator_base(&iter.it_,m);
    while (iter.it_.node_ != (Node *)0x0) {
      MapValueRef::DeleteData((MapValueRef *)&(iter.it_.node_)->field_0x28);
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
      ::operator++(&iter.it_);
    }
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::clear(m);
  pRVar5 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  pRVar8 = (pRVar5->super_RepeatedPtrFieldBase).rep_;
  ppvVar10 = pRVar8->elements;
  if (pRVar8 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  local_b8 = m;
  do {
    ppvVar9 = pRVar8->elements;
    if (pRVar8 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    if (ppvVar10 == ppvVar9 + (pRVar5->super_RepeatedPtrFieldBase).current_size_) {
      return;
    }
    map_key.type_ = 0;
    CVar3 = FieldDescriptor::cpp_type(this_00);
    switch(CVar3) {
    case CPPTYPE_INT32:
      value = Reflection::GetInt32(this_03,(Message *)*ppvVar10,this_00);
      MapKey::SetInt32Value(&map_key,value);
      break;
    case CPPTYPE_INT64:
      value_01 = Reflection::GetInt64(this_03,(Message *)*ppvVar10,this_00);
      MapKey::SetInt64Value(&map_key,value_01);
      break;
    case CPPTYPE_UINT32:
      uVar4 = Reflection::GetUInt32(this_03,(Message *)*ppvVar10,this_00);
      MapKey::SetUInt32Value(&map_key,uVar4);
      break;
    case CPPTYPE_UINT64:
      value_00 = Reflection::GetUInt64(this_03,(Message *)*ppvVar10,this_00);
      MapKey::SetUInt64Value(&map_key,value_00);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                ((LogMessage *)&iter,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                 ,0x22b);
      other = LogMessage::operator<<((LogMessage *)&iter,"Can\'t get here.");
      LogFinisher::operator=(&local_b9,other);
      LogMessage::~LogMessage((LogMessage *)&iter);
      break;
    case CPPTYPE_BOOL:
      bVar1 = Reflection::GetBool(this_03,(Message *)*ppvVar10,this_00);
      MapKey::SetBoolValue(&map_key,bVar1);
      break;
    case CPPTYPE_STRING:
      Reflection::GetString_abi_cxx11_(&local_78,this_03,(Message *)*ppvVar10,this_00);
      MapKey::SetStringValue(&map_key,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    if (((this->
         super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
         super_MapFieldBase.arena_ == (Arena *)0x0) &&
       (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
        find<google::protobuf::MapKey>((iterator *)&iter,m,&map_key), iter.it_.node_ != (Node *)0x0)
       ) {
      MapValueRef::DeleteData((MapValueRef *)&(iter.it_.node_)->field_0x28);
    }
    pvVar6 = Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::
             operator[]<google::protobuf::MapKey_const&>((InnerMap *)m,&map_key);
    CVar3 = FieldDescriptor::cpp_type(this_01);
    *(CppType *)(pvVar6 + 0x30) = CVar3;
    CVar3 = FieldDescriptor::cpp_type(this_01);
    switch(CVar3) {
    case CPPTYPE_INT32:
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Arena::Create<int>((this->
                                   super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                   ).super_MapFieldBase.arena_);
      uVar4 = Reflection::GetInt32(this_03,(Message *)*ppvVar10,this_01);
      goto LAB_003a2191;
    case CPPTYPE_INT64:
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Arena::Create<long>((this->
                                    super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                    ).super_MapFieldBase.arena_);
      pcVar12 = (pointer)Reflection::GetInt64(this_03,(Message *)*ppvVar10,this_01);
      goto LAB_003a21b7;
    case CPPTYPE_UINT32:
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Arena::Create<unsigned_int>
                          ((this->
                           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                           ).super_MapFieldBase.arena_);
      uVar4 = Reflection::GetUInt32(this_03,(Message *)*ppvVar10,this_01);
      goto LAB_003a2191;
    case CPPTYPE_UINT64:
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Arena::Create<unsigned_long>
                          ((this->
                           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                           ).super_MapFieldBase.arena_);
      pcVar12 = (pointer)Reflection::GetUInt64(this_03,(Message *)*ppvVar10,this_01);
LAB_003a21b7:
      (this_02->_M_dataplus)._M_p = pcVar12;
      break;
    case CPPTYPE_DOUBLE:
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Arena::Create<double>
                          ((this->
                           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                           ).super_MapFieldBase.arena_);
      pcVar12 = (pointer)Reflection::GetDouble(this_03,(Message *)*ppvVar10,this_01);
      (this_02->_M_dataplus)._M_p = pcVar12;
      break;
    case CPPTYPE_FLOAT:
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Arena::Create<float>
                          ((this->
                           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                           ).super_MapFieldBase.arena_);
      fVar11 = Reflection::GetFloat(this_03,(Message *)*ppvVar10,this_01);
      *(float *)&(this_02->_M_dataplus)._M_p = fVar11;
      break;
    case CPPTYPE_BOOL:
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Arena::Create<bool>((this->
                                    super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                    ).super_MapFieldBase.arena_);
      bVar1 = Reflection::GetBool(this_03,(Message *)*ppvVar10,this_01);
      *(bool *)&(this_02->_M_dataplus)._M_p = bVar1;
      break;
    case CPPTYPE_ENUM:
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Arena::Create<int>((this->
                                   super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                   ).super_MapFieldBase.arena_);
      uVar4 = Reflection::GetEnumValue(this_03,(Message *)*ppvVar10,this_01);
LAB_003a2191:
      *(uint32_t *)&(this_02->_M_dataplus)._M_p = uVar4;
      break;
    case CPPTYPE_STRING:
      this_02 = Arena::Create<std::__cxx11::string>
                          ((this->
                           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                           ).super_MapFieldBase.arena_);
      Reflection::GetString_abi_cxx11_((string *)&iter,this_03,(Message *)*ppvVar10,this_01);
      std::__cxx11::string::operator=((string *)this_02,(string *)&iter);
      std::__cxx11::string::~string((string *)&iter);
      break;
    case CPPTYPE_MESSAGE:
      pMVar7 = Reflection::GetMessage(this_03,(Message *)*ppvVar10,this_01,(MessageFactory *)0x0);
      iVar2 = (*(pMVar7->super_MessageLite)._vptr_MessageLite[3])
                        (pMVar7,(this->
                                super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                ).super_MapFieldBase.arena_);
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(extraout_var_01,iVar2);
      (**(code **)((this_02->_M_dataplus)._M_p + 0x68))(this_02,pMVar7);
      break;
    default:
      goto switchD_003a20ae_default;
    }
    *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pvVar6 + 0x28) = this_02
    ;
    m = local_b8;
switchD_003a20ae_default:
    MapKey::~MapKey(&map_key);
    ppvVar10 = ppvVar10 + 1;
    pRVar5 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.repeated_field_;
    pRVar8 = (pRVar5->super_RepeatedPtrFieldBase).rep_;
  } while( true );
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des = default_entry_->GetDescriptor()->map_key();
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  if (MapFieldBase::arena_ == nullptr) {
    for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
         iter != map->end(); ++iter) {
      iter->second.DeleteData();
    }
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    // MapKey type will be set later.
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    if (MapFieldBase::arena_ == nullptr) {
      // Remove existing map value with same key.
      Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
      if (iter != map->end()) {
        iter->second.DeleteData();
      }
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)                   \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    *value = reflection->Get##METHOD(*it, val_des);          \
    map_val.SetValue(value);                                 \
    break;                                                   \
  }
      HANDLE_TYPE(INT32, int32_t, Int32);
      HANDLE_TYPE(INT64, int64_t, Int64);
      HANDLE_TYPE(UINT32, uint32_t, UInt32);
      HANDLE_TYPE(UINT64, uint64_t, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, std::string, String);
      HANDLE_TYPE(ENUM, int32_t, EnumValue);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New(MapFieldBase::arena_);
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}